

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

void free_D_Scope(D_Scope *st,int force)

{
  D_Scope *pDVar1;
  D_SymHash *__ptr;
  D_Sym *pDVar2;
  D_Sym *pDVar3;
  D_Scope *st_00;
  ulong uVar4;
  
  st_00 = st->down;
  while (st_00 != (D_Scope *)0x0) {
    pDVar1 = st_00->down_next;
    free_D_Scope(st_00,0);
    st->down = pDVar1;
    st_00 = pDVar1;
  }
  if ((force == 0) &&
     ((undefined1  [80])((undefined1  [80])*st & (undefined1  [80])0x4) != (undefined1  [80])0x0)) {
    return;
  }
  __ptr = st->hash;
  if (__ptr == (D_SymHash *)0x0) {
    pDVar2 = st->ll;
    while (pDVar2 != (D_Sym *)0x0) {
      pDVar3 = pDVar2->next;
      free(pDVar2);
      st->ll = pDVar3;
      pDVar2 = pDVar3;
    }
  }
  else {
    if ((__ptr->syms).n != 0) {
      uVar4 = 0;
      do {
        while (pDVar2 = (__ptr->syms).v[uVar4], pDVar2 != (D_Sym *)0x0) {
          pDVar3 = pDVar2->next;
          free(pDVar2);
          (__ptr->syms).v[uVar4] = pDVar3;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (__ptr->syms).n);
    }
    free((__ptr->syms).v);
    free(__ptr);
  }
  pDVar2 = st->updates;
  while (pDVar2 != (D_Sym *)0x0) {
    pDVar3 = pDVar2->next;
    free(pDVar2);
    st->updates = pDVar3;
    pDVar2 = pDVar3;
  }
  free(st);
  return;
}

Assistant:

void free_D_Scope(D_Scope *st, int force) {
  D_Scope *s;
  D_Sym *sym;
  for (; st->down; st->down = s) {
    s = st->down->down_next;
    free_D_Scope(st->down, 0);
  }
  if (st->owned_by_user && !force) return;
  if (st->hash)
    free_D_SymHash(st->hash);
  else
    for (; st->ll; st->ll = sym) {
      sym = st->ll->next;
      free_D_Sym(st->ll);
    }
  for (; st->updates; st->updates = sym) {
    sym = st->updates->next;
    free_D_Sym(st->updates);
  }
  FREE(st);
}